

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O0

void __thiscall QTemporaryFilePrivate::materializeUnnamedFile(QTemporaryFilePrivate *this)

{
  bool bVar1;
  pointer this_00;
  QString *in_RDI;
  long in_FS_OFFSET;
  QTemporaryFileEngine *tef;
  unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
  *in_stack_ffffffffffffffd0;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x2f9600);
  if ((bVar1) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                          *)0x2f9616), bVar1)) {
    this_00 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::get
                        (in_stack_ffffffffffffffd0);
    (*this_00->_vptr_QAbstractFileEngine[0x19])(local_20,this_00,0);
    QString::operator=((QString *)this_00,in_RDI);
    QString::~QString((QString *)0x2f9665);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTemporaryFilePrivate::materializeUnnamedFile()
{
#ifdef LINUX_UNNAMED_TMPFILE
    if (!fileName.isEmpty() || !fileEngine)
        return;

    auto *tef = static_cast<QTemporaryFileEngine *>(fileEngine.get());
    fileName = tef->fileName(QAbstractFileEngine::DefaultName);
#endif
}